

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void CreateFunctionArgumentVariables
               (ExpressionContext *ctx,SynBase *source,FunctionData *function,
               ArrayView<ArgumentData> arguments,IntrusiveList<ExprVariableDefinition> *variables)

{
  uint uniqueId;
  TypeBase *pTVar1;
  SynBase *pSVar2;
  SynIdentifier *name;
  bool bVar3;
  uint offset;
  int iVar4;
  ArgumentData *pAVar5;
  undefined4 extraout_var;
  ExprVariableDefinition *node;
  VariableHandle *pVVar6;
  undefined4 extraout_var_02;
  char *pcVar7;
  uint index;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_local;
  VariableData *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pcVar7 = arguments._8_8_;
  arguments_local.data = arguments.data;
  arguments_local.count = arguments.count;
  index = 0;
  while( true ) {
    if ((uint)pcVar7 <= index) {
      return;
    }
    pAVar5 = ArrayView<ArgumentData>::operator[](&arguments_local,index);
    if (pAVar5->type->isGeneric == true) break;
    name_00.end = pcVar7;
    name_00.begin = (pAVar5->name->name).end;
    bVar3 = anon_unknown.dwarf_ff84f::CheckVariableConflict
                      ((anon_unknown_dwarf_ff84f *)ctx,(ExpressionContext *)pAVar5->source,
                       (SynBase *)(pAVar5->name->name).begin,name_00);
    offset = anon_unknown.dwarf_ff84f::AllocateArgumentInScope(ctx,source,4,pAVar5->type);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    this = (VariableData *)CONCAT44(extraout_var,iVar4);
    pTVar1 = pAVar5->type;
    pSVar2 = pAVar5->source;
    name = pAVar5->name;
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData(this,ctx->allocator,pSVar2,ctx->scope,0,pTVar1,name,offset,uniqueId);
    pTVar1 = this->type;
    if (((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0x18)) &&
       (*(char *)((long)&pTVar1[3]._vptr_TypeBase + 2) == '\x01')) {
      anon_unknown.dwarf_ff84f::Stop
                (ctx,pAVar5->source,
                 "ERROR: cannot create \'%.*s\' that implements \'finalize\' on stack",
                 (ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin));
    }
    if (!bVar3) {
      ExpressionContext::AddVariable(ctx,this,true);
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    node = (ExprVariableDefinition *)CONCAT44(extraout_var_00,iVar4);
    pSVar2 = pAVar5->source;
    pTVar1 = ctx->typeVoid;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pVVar6 = (VariableHandle *)CONCAT44(extraout_var_01,iVar4);
    pVVar6->source = &pAVar5->name->super_SynBase;
    pVVar6->variable = this;
    pVVar6->next = (VariableHandle *)0x0;
    pVVar6->listed = false;
    (node->super_ExprBase).typeID = 0x1e;
    (node->super_ExprBase).source = pSVar2;
    (node->super_ExprBase).type = pTVar1;
    (node->super_ExprBase).next = (ExprBase *)0x0;
    (node->super_ExprBase).listed = false;
    (node->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
    node->variable = pVVar6;
    node->initializer = (ExprBase *)0x0;
    IntrusiveList<ExprVariableDefinition>::push_back(variables,node);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pVVar6 = (VariableHandle *)CONCAT44(extraout_var_02,iVar4);
    pVVar6->source = pAVar5->source;
    pVVar6->variable = this;
    pVVar6->next = (VariableHandle *)0x0;
    pVVar6->listed = false;
    IntrusiveList<VariableHandle>::push_back(&function->argumentVariables,pVVar6);
    index = index + 1;
    pcVar7 = (char *)(ulong)arguments_local.count;
  }
  __assert_fail("!argument.type->isGeneric",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x226b,
                "void CreateFunctionArgumentVariables(ExpressionContext &, SynBase *, FunctionData *, ArrayView<ArgumentData>, IntrusiveList<ExprVariableDefinition> &)"
               );
}

Assistant:

void CreateFunctionArgumentVariables(ExpressionContext &ctx, SynBase *source, FunctionData *function, ArrayView<ArgumentData> arguments, IntrusiveList<ExprVariableDefinition> &variables)
{
	for(unsigned i = 0; i < arguments.size(); i++)
	{
		ArgumentData &argument = arguments[i];

		assert(!argument.type->isGeneric);

		bool conflict = CheckVariableConflict(ctx, argument.source, argument.name->name);

		unsigned offset = AllocateArgumentInScope(ctx, source, 4, argument.type);
		VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, argument.source, ctx.scope, 0, argument.type, argument.name, offset, ctx.uniqueVariableId++);

		if(TypeClass *classType = getType<TypeClass>(variable->type))
		{
			if(classType->hasFinalizer)
				Stop(ctx, argument.source, "ERROR: cannot create '%.*s' that implements 'finalize' on stack", FMT_ISTR(classType->name));
		}

		if(!conflict)
			ctx.AddVariable(variable, true);

		variables.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(argument.source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(argument.name, variable), NULL));

		function->argumentVariables.push_back(new (ctx.get<VariableHandle>()) VariableHandle(argument.source, variable));
	}
}